

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hpp
# Opt level: O0

void __thiscall
duckdb::roaring::CompressedArrayContainerScanState<true>::Verify
          (CompressedArrayContainerScanState<true> *this)

{
  CompressedArrayContainerScanState<true> *this_local;
  
  return;
}

Assistant:

void Verify() const override {
#ifdef DEBUG
		uint16_t index = 0;
		ContainerSegmentScan verify_segment(segments);
		for (uint16_t i = 0; i < this->count; i++) {
			// Get the value
			uint16_t new_index = verify_segment++;
			new_index += reinterpret_cast<uint8_t *>(this->data)[i];

			D_ASSERT(!i || new_index > index);
			index = new_index;
		}
#endif
	}